

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

END_HANDLE end_clone(END_HANDLE value)

{
  AMQP_VALUE pAVar1;
  END_HANDLE local_18;
  END_INSTANCE *end_instance;
  END_HANDLE value_local;
  
  local_18 = (END_HANDLE)malloc(8);
  if (local_18 != (END_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (END_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

END_HANDLE end_clone(END_HANDLE value)
{
    END_INSTANCE* end_instance = (END_INSTANCE*)malloc(sizeof(END_INSTANCE));
    if (end_instance != NULL)
    {
        end_instance->composite_value = amqpvalue_clone(((END_INSTANCE*)value)->composite_value);
        if (end_instance->composite_value == NULL)
        {
            free(end_instance);
            end_instance = NULL;
        }
    }

    return end_instance;
}